

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

HFSubWorker * __thiscall
AbstractModuleClient::subscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule,
          hfs_data_callback_fn userFoo,void *args)

{
  pointer pcVar1;
  bool bVar2;
  HFSubWorker *pHVar3;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  HighFreqDataType local_c0;
  
  pcVar1 = (dataName->_M_dataplus)._M_p;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + dataName->_M_string_length);
  pcVar1 = (originModule->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + originModule->_M_string_length);
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_e0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar1 = (dataName->_M_dataplus)._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar1,pcVar1 + dataName->_M_string_length);
    pcVar1 = (originModule->_M_dataplus)._M_p;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar1,pcVar1 + originModule->_M_string_length);
    pHVar3 = (HFSubWorker *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_120,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((pHVar3->super_HighFreqSub).sockType == ST_WORKER) {
      return pHVar3;
    }
  }
  bVar2 = network_pimpl::hfdt_exists((this->super_MlmWrap).state,dataName,originModule);
  if (bVar2) {
    network_pimpl::find_hfdt(&local_c0,(this->super_MlmWrap).state,dataName,originModule);
    pHVar3 = MlmWrap::createWorkerSub(&this->super_MlmWrap,&local_c0,1,userFoo,args);
    HighFreqDataType::~HighFreqDataType(&local_c0);
  }
  else {
    pHVar3 = (HFSubWorker *)0x0;
  }
  return pHVar3;
}

Assistant:

HFSubWorker* AbstractModuleClient::subscribeHighFreqData(std::string dataName, std::string originModule, hfs_data_callback_fn userFoo, void *args) {
    if (isHfTypeCurrentlySubbed(dataName, originModule)) { //if the module is already subbed, return the current sub object
        HighFreqSub* sub = getHfSubObject(dataName, originModule);
        if(sub->getSubSockType() == HighFreqSub::ST_WORKER)
            return (HFSubWorker*)sub;
    }

    if (state->hfdt_exists(dataName, originModule)) { //check to make sure the requested type is provided by another module
        return( createWorkerSub( state->find_hfdt(dataName, originModule), 1, userFoo, args ) );
    }
    else {
        // std::cerr << error("The specified type does not exist. Could not create Subscriber\n");
        return(NULL);
    }
}